

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall pugi::xml_document::reset(xml_document *this,xml_document *proto)

{
  xml_node_struct *pxVar1;
  xml_node local_20;
  
  _destroy(this);
  _create(this);
  pxVar1 = (proto->super_xml_node)._root;
  if (pxVar1 != (xml_node_struct *)0x0) {
    pxVar1 = pxVar1->first_child;
    if (pxVar1 != (xml_node_struct *)0x0) {
      do {
        local_20._root = pxVar1;
        xml_node::append_copy(&this->super_xml_node,&local_20);
        pxVar1 = pxVar1->next_sibling;
      } while (pxVar1 != (xml_node_struct *)0x0);
    }
  }
  return;
}

Assistant:

PUGI__FN void xml_document::reset(const xml_document& proto)
	{
		reset();

		for (xml_node cur = proto.first_child(); cur; cur = cur.next_sibling())
			append_copy(cur);
	}